

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O2

void igSetNextWindowPos(ImVec2 pos,ImGuiCond cond,ImVec2 pivot)

{
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_10 = pivot;
  local_8 = pos;
  ImGui::SetNextWindowPos(&local_8,cond,&local_10);
  return;
}

Assistant:

CIMGUI_API void _igSetNextWindowPos (ImVec2 const *larg1, ImGuiCond arg2, ImVec2 const *larg3) {
  ImVec2 arg1 ;
  ImVec2 arg3 ;
  
  arg1 = *larg1;
  arg3 = *larg3;
  try {
    igSetNextWindowPos(arg1,arg2,arg3);
    
  } catch (...) {
    
  }
}